

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Power.cpp
# Opt level: O2

void CoreMLConverter::convertCaffePower(ConvertLayerParameters layerParameters)

{
  int iVar1;
  Rep *pRVar2;
  Type *pTVar3;
  NeuralNetworkLayer *this;
  UnaryFunctionLayerParams *pUVar4;
  PowerParameter *pPVar5;
  void **ppvVar6;
  long lVar7;
  long lVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  top;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bottom;
  
  pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                     (&((layerParameters.prototxt)->layer_).super_RepeatedPtrFieldBase,
                      *layerParameters.layerId);
  this = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                   (layerParameters.nnWrite);
  if (((pTVar3->bottom_).super_RepeatedPtrFieldBase.current_size_ == 1) &&
     ((pTVar3->top_).super_RepeatedPtrFieldBase.current_size_ == 1)) {
    lVar8 = 1;
  }
  else {
    std::__cxx11::string::string
              ((string *)&bottom,"Must have 1 input and 1 output",(allocator *)&top);
    errorInCaffeProto((string *)&bottom,(pTVar3->name_).ptr_,(pTVar3->type_).ptr_);
    std::__cxx11::string::~string((string *)&bottom);
    lVar8 = (long)(pTVar3->bottom_).super_RepeatedPtrFieldBase.current_size_;
  }
  bottom.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bottom.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  bottom.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  top.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  top.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  top.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pRVar2 = (pTVar3->bottom_).super_RepeatedPtrFieldBase.rep_;
  ppvVar6 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar6 = (void **)0x0;
  }
  for (lVar7 = 0; lVar8 * 8 != lVar7; lVar7 = lVar7 + 8) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&bottom,*(value_type **)((long)ppvVar6 + lVar7));
  }
  pRVar2 = (pTVar3->top_).super_RepeatedPtrFieldBase.rep_;
  ppvVar6 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar6 = (void **)0x0;
  }
  iVar1 = (pTVar3->top_).super_RepeatedPtrFieldBase.current_size_;
  for (lVar8 = 0; (long)iVar1 * 8 != lVar8; lVar8 = lVar8 + 8) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&top,*(value_type **)((long)ppvVar6 + lVar8));
  }
  convertCaffeMetadata
            ((pTVar3->name_).ptr_,&bottom,&top,layerParameters.nnWrite,
             layerParameters.mappingDataBlobNames);
  pPVar5 = pTVar3->power_param_;
  pUVar4 = CoreML::Specification::NeuralNetworkLayer::mutable_unary(this);
  if (pPVar5 == (PowerParameter *)0x0) {
    pPVar5 = (PowerParameter *)&caffe::_PowerParameter_default_instance_;
  }
  pUVar4->type_ = 3;
  pUVar4->shift_ = pPVar5->shift_;
  pUVar4->scale_ = pPVar5->scale_;
  pUVar4->alpha_ = pPVar5->power_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&top);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&bottom);
  return;
}

Assistant:

void CoreMLConverter::convertCaffePower(CoreMLConverter::ConvertLayerParameters layerParameters) {
    
    
    int layerId = *layerParameters.layerId;
    const caffe::LayerParameter& caffeLayer = layerParameters.prototxt.layer(layerId);
    std::map<std::string, std::string>& mappingDataBlobNames = layerParameters.mappingDataBlobNames;
    
    //Write Layer metadata
    auto* nnWrite = layerParameters.nnWrite;
    Specification::NeuralNetworkLayer* specLayer = nnWrite->Add();
    if (caffeLayer.bottom_size() != 1 || caffeLayer.top_size() != 1) {
        CoreMLConverter::errorInCaffeProto("Must have 1 input and 1 output",caffeLayer.name(),caffeLayer.type());
    }
    std::vector<std::string> bottom;
    std::vector<std::string> top;
    for (const auto& bottomName: caffeLayer.bottom()){
        bottom.push_back(bottomName);
    }
    for (const auto& topName: caffeLayer.top()){
        top.push_back(topName);
    }
    CoreMLConverter::convertCaffeMetadata(caffeLayer.name(), 
                                         bottom, top,
                                         nnWrite, mappingDataBlobNames);
    
    const caffe::PowerParameter& caffeLayerParams = caffeLayer.power_param();
    
    //***************** Some Error Checking in Caffe Proto **********
    //nothing
    //***************************************************************
    
    Specification::UnaryFunctionLayerParams* specLayerParams = specLayer->mutable_unary();
    specLayerParams->set_type(Specification::UnaryFunctionLayerParams::POWER);
    specLayerParams->set_shift(caffeLayerParams.shift());
    specLayerParams->set_scale(caffeLayerParams.scale());
    specLayerParams->set_alpha(caffeLayerParams.power());
    
}